

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

InternalParseResult * __thiscall
Catch::clara::detail::Parser::parse
          (InternalParseResult *__return_storage_ptr__,Parser *this,string *exeName,
          TokenStream *tokens)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pOVar2;
  pointer pAVar3;
  long *plVar4;
  ulong uVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  ulong *puVar12;
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *pvVar13;
  ulong uVar14;
  long lVar15;
  const_iterator __begin3_1;
  pointer pAVar16;
  const_iterator __begin3;
  pointer pOVar17;
  ulong uVar18;
  bool bVar19;
  BasicResult<Catch::clara::detail::ParseState> result;
  ParserInfo parseInfos [512];
  undefined1 local_2170 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2130;
  string *local_2110;
  undefined1 local_2108 [16];
  undefined1 local_20f8 [32];
  undefined1 local_20d8 [16];
  undefined1 auStack_20c8 [24];
  vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> local_20b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2098;
  Iterator *local_2078;
  ulong local_2070;
  ParserResult local_2068;
  ulong local_2038 [1025];
  
  pOVar17 = (this->m_options).
            super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pOVar2 = (this->m_options).
           super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar3 = (this->m_args).
           super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar16 = (this->m_args).
            super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_2070 = ((long)pAVar3 - (long)pAVar16 >> 5) * -0x5555555555555555 +
               ((long)pOVar2 - (long)pOVar17 >> 3) * -0x1111111111111111;
  local_2110 = exeName;
  if (0x1ff < local_2070) {
    __assert_fail("totalParsers < 512",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Toxe[P]catch2-examples/src/single_header/single_test_file_one_source/include/catch2/catch.hpp"
                  ,0x2580,
                  "virtual InternalParseResult Catch::clara::detail::Parser::parse(const std::string &, const TokenStream &) const"
                 );
  }
  puVar12 = local_2038;
  lVar15 = 0;
  memset(puVar12,0,0x2000);
  if (pOVar17 != pOVar2) {
    lVar15 = 0;
    do {
      lVar15 = lVar15 + 1;
      *puVar12 = (ulong)pOVar17;
      pOVar17 = pOVar17 + 1;
      puVar12 = puVar12 + 2;
    } while (pOVar17 != pOVar2);
  }
  if (pAVar16 != pAVar3) {
    puVar12 = local_2038 + lVar15 * 2;
    do {
      *puVar12 = (ulong)pAVar16;
      pAVar16 = pAVar16 + 1;
      puVar12 = puVar12 + 2;
    } while (pAVar16 != pAVar3);
  }
  ExeName::set(&local_2068,&this->m_exeName,local_2110);
  local_2068.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001848c8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2068.m_errorMessage._M_dataplus._M_p != &local_2068.m_errorMessage.field_2) {
    operator_delete(local_2068.m_errorMessage._M_dataplus._M_p,
                    local_2068.m_errorMessage.field_2._M_allocated_capacity + 1);
  }
  local_2068.super_ResultValueBase<Catch::clara::detail::ParseResultType>.super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_00184920;
  pvVar13 = (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
            (auStack_20c8 + 8);
  local_20d8._0_4_ = 1;
  local_20d8._8_8_ = (tokens->it)._M_current;
  auStack_20c8._0_8_ = (tokens->itEnd)._M_current;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
            (pvVar13,&tokens->m_tokenBuffer);
  local_2170._8_4_ = Ok;
  local_2170._0_8_ = &PTR__ResultValueBase_001847c0;
  local_2170._16_4_ = local_20d8._0_4_;
  local_2170._24_8_ = local_20d8._8_8_;
  local_2170._32_8_ = auStack_20c8._0_8_;
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
            ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
             (local_2170 + 0x28),pvVar13);
  local_2170._0_8_ = &PTR__BasicResult_00184768;
  local_2130._M_dataplus._M_p = (pointer)&local_2130.field_2;
  local_2130._M_string_length = 0;
  local_2130.field_2._M_local_buf[0] = '\0';
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
            (pvVar13);
  paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
  local_2078 = (Iterator *)
               ((long)&(__return_storage_ptr__->
                       super_ResultValueBase<Catch::clara::detail::ParseState>).field_0 + 8);
  pvVar13 = &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
             field_0.m_value.m_remainingTokens.m_tokenBuffer;
  do {
    (**(_func_int **)(local_2170._0_8_ + 0x10))
              ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2170);
    local_20d8._0_8_ = local_2170._24_8_;
    local_20d8._8_8_ = local_2170._32_8_;
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
              ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               auStack_20c8,
               (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               (local_2170 + 0x28));
    uVar10 = auStack_20c8._8_8_;
    uVar9 = auStack_20c8._0_8_;
    uVar8 = local_20d8._8_8_;
    uVar7 = local_20d8._0_8_;
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
              ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               auStack_20c8);
    if ((uVar9 == uVar10) && (uVar7 == uVar8)) {
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultBase_00184740;
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase.m_type = local_2170._8_4_;
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_001847c0;
      if (local_2170._8_4_ == Ok) {
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_type = local_2170._16_4_;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_remainingTokens.it._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2170._24_8_;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
        m_value.m_remainingTokens.itEnd._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2170._32_8_;
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        vector(pvVar13,(vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                        *)(local_2170 + 0x28));
      }
      (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00184768;
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2130._M_dataplus._M_p == &local_2130.field_2) {
        paVar1->_M_allocated_capacity =
             CONCAT71(local_2130.field_2._M_allocated_capacity._1_7_,
                      local_2130.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) =
             local_2130.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_2130._M_dataplus._M_p;
        (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
             CONCAT71(local_2130.field_2._M_allocated_capacity._1_7_,
                      local_2130.field_2._M_local_buf[0]);
      }
      (__return_storage_ptr__->m_errorMessage)._M_string_length = local_2130._M_string_length;
      local_2130._M_string_length = 0;
      local_2130.field_2._M_local_buf[0] = '\0';
      local_2130._M_dataplus._M_p = (pointer)&local_2130.field_2;
      break;
    }
    if (local_2070 == 0) {
      iVar11 = 8;
      bVar19 = false;
    }
    else {
      bVar19 = false;
      puVar12 = local_2038 + 1;
      uVar18 = local_2070;
      do {
        plVar4 = (long *)puVar12[-1];
        lVar15 = (**(code **)(*plVar4 + 0x20))(plVar4);
        if ((lVar15 == 0) ||
           (uVar5 = *puVar12, uVar14 = (**(code **)(*plVar4 + 0x20))(plVar4), uVar5 < uVar14)) {
          (**(_func_int **)(local_2170._0_8_ + 0x10))
                    ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2170);
          local_2108._0_8_ = local_2170._24_8_;
          local_2108._8_8_ = local_2170._32_8_;
          std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          vector((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                  *)local_20f8,
                 (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                  *)(local_2170 + 0x28));
          (**(code **)(*plVar4 + 0x18))
                    ((ResultValueBase<Catch::clara::detail::ParseState> *)local_20d8,plVar4,
                     local_2110);
          ResultValueBase<Catch::clara::detail::ParseState>::operator=
                    ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2170,
                     (ResultValueBase<Catch::clara::detail::ParseState> *)local_20d8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_2130,&local_2098);
          local_20d8._0_8_ = &PTR__BasicResult_00184768;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2098._M_dataplus._M_p != &local_2098.field_2) {
            operator_delete(local_2098._M_dataplus._M_p,local_2098.field_2._M_allocated_capacity + 1
                           );
          }
          local_20d8._0_8_ = &PTR__ResultValueBase_001847c0;
          if (local_20d8._8_4_ == Ok) {
            std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
            ~vector(&local_20b0);
          }
          std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          ~vector((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                   *)local_20f8);
          if (local_2170._8_4_ == Ok) {
            (**(_func_int **)(local_2170._0_8_ + 0x10))
                      ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2170);
            if (local_2170._16_4_ == NoMatch) goto LAB_0013f561;
            *puVar12 = *puVar12 + 1;
            iVar11 = 8;
            bVar19 = true;
          }
          else {
            (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
            super_ResultBase.m_type = local_2170._8_4_;
            (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
            super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00184768;
            (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2130._M_dataplus._M_p == &local_2130.field_2) {
              paVar1->_M_allocated_capacity =
                   CONCAT71(local_2130.field_2._M_allocated_capacity._1_7_,
                            local_2130.field_2._M_local_buf[0]);
              *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) =
                   local_2130.field_2._8_8_;
            }
            else {
              (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
                   local_2130._M_dataplus._M_p;
              (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
                   CONCAT71(local_2130.field_2._M_allocated_capacity._1_7_,
                            local_2130.field_2._M_local_buf[0]);
            }
            (__return_storage_ptr__->m_errorMessage)._M_string_length = local_2130._M_string_length;
            local_2130._M_string_length = 0;
            local_2130.field_2._M_local_buf[0] = '\0';
            iVar11 = 1;
            local_2130._M_dataplus._M_p = (pointer)&local_2130.field_2;
          }
          bVar6 = false;
        }
        else {
LAB_0013f561:
          iVar11 = 0;
          bVar6 = true;
        }
        if (!bVar6) goto LAB_0013f6ef;
        puVar12 = puVar12 + 2;
        uVar18 = uVar18 - 1;
      } while (uVar18 != 0);
      iVar11 = 8;
    }
LAB_0013f6ef:
    if (iVar11 == 8) {
      (**(_func_int **)(local_2170._0_8_ + 0x10))
                ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2170);
      if (local_2170._16_4_ == ShortCircuitAll) {
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
        super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultBase_00184740;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
        super_ResultBase.m_type = local_2170._8_4_;
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
        super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__ResultValueBase_001847c0;
        if (local_2170._8_4_ == Ok) {
          (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).field_0.
          m_value.m_type = ShortCircuitAll;
          local_2078->_M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_2170._24_8_;
          local_2078[1]._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_2170._32_8_;
          std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
          vector(pvVar13,(vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
                          *)(local_2170 + 0x28));
        }
        (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseState>).
        super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00184768;
        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2130._M_dataplus._M_p == &local_2130.field_2) {
          paVar1->_M_allocated_capacity =
               CONCAT71(local_2130.field_2._M_allocated_capacity._1_7_,
                        local_2130.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8) =
               local_2130.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = local_2130._M_dataplus._M_p;
          (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
               CONCAT71(local_2130.field_2._M_allocated_capacity._1_7_,
                        local_2130.field_2._M_local_buf[0]);
        }
        (__return_storage_ptr__->m_errorMessage)._M_string_length = local_2130._M_string_length;
        local_2130._M_string_length = 0;
        local_2130.field_2._M_local_buf[0] = '\0';
        local_2130._M_dataplus._M_p = (pointer)&local_2130.field_2;
      }
      else {
        iVar11 = 0;
        if (bVar19) goto LAB_0013f86e;
        (**(_func_int **)(local_2170._0_8_ + 0x10))
                  ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2170);
        local_20d8._0_8_ = local_2170._24_8_;
        local_20d8._8_8_ = local_2170._32_8_;
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        vector((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               auStack_20c8,
               (vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               (local_2170 + 0x28));
        if (auStack_20c8._0_8_ == auStack_20c8._8_8_) {
          __assert_fail("!m_tokenBuffer.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Toxe[P]catch2-examples/src/single_header/single_test_file_one_source/include/catch2/catch.hpp"
                        ,0x22d2,"const Token *Catch::clara::detail::TokenStream::operator->() const"
                       );
        }
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2108,"Unrecognised token: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (auStack_20c8._0_8_ + 8));
        BasicResult<Catch::clara::detail::ParseState>::BasicResult
                  (__return_storage_ptr__,RuntimeError,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2108);
        if ((pointer)local_2108._0_8_ != (pointer)local_20f8) {
          operator_delete((void *)local_2108._0_8_,(ulong)(local_20f8._0_8_ + 1));
        }
        std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::
        ~vector((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *
                )auStack_20c8);
      }
      iVar11 = 1;
    }
LAB_0013f86e:
  } while (iVar11 == 0);
  local_2170._0_8_ = &PTR__BasicResult_00184768;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2130._M_dataplus._M_p != &local_2130.field_2) {
    operator_delete(local_2130._M_dataplus._M_p,
                    CONCAT71(local_2130.field_2._M_allocated_capacity._1_7_,
                             local_2130.field_2._M_local_buf[0]) + 1);
  }
  local_2170._0_8_ = &PTR__ResultValueBase_001847c0;
  if (local_2170._8_4_ == Ok) {
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
              ((vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_> *)
               (local_2170 + 0x28));
  }
  return __return_storage_ptr__;
}

Assistant:

auto parse( std::string const& exeName, TokenStream const &tokens ) const -> InternalParseResult override {

            struct ParserInfo {
                ParserBase const* parser = nullptr;
                size_t count = 0;
            };
            const size_t totalParsers = m_options.size() + m_args.size();
            assert( totalParsers < 512 );
            // ParserInfo parseInfos[totalParsers]; // <-- this is what we really want to do
            ParserInfo parseInfos[512];

            {
                size_t i = 0;
                for (auto const &opt : m_options) parseInfos[i++].parser = &opt;
                for (auto const &arg : m_args) parseInfos[i++].parser = &arg;
            }

            m_exeName.set( exeName );

            auto result = InternalParseResult::ok( ParseState( ParseResultType::NoMatch, tokens ) );
            while( result.value().remainingTokens() ) {
                bool tokenParsed = false;

                for( size_t i = 0; i < totalParsers; ++i ) {
                    auto&  parseInfo = parseInfos[i];
                    if( parseInfo.parser->cardinality() == 0 || parseInfo.count < parseInfo.parser->cardinality() ) {
                        result = parseInfo.parser->parse(exeName, result.value().remainingTokens());
                        if (!result)
                            return result;
                        if (result.value().type() != ParseResultType::NoMatch) {
                            tokenParsed = true;
                            ++parseInfo.count;
                            break;
                        }
                    }
                }

                if( result.value().type() == ParseResultType::ShortCircuitAll )
                    return result;
                if( !tokenParsed )
                    return InternalParseResult::runtimeError( "Unrecognised token: " + result.value().remainingTokens()->token );
            }
            // !TBD Check missing required options
            return result;
        }